

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblySource.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblySource::ReadBufferSource
          (WebAssemblySource *this,Var val,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  Recycler *pRVar7;
  uchar *puVar8;
  TrackAllocData local_60;
  ArrayBuffer *local_38;
  ArrayBuffer *arrayBuffer;
  TypedArrayBase *array;
  BYTE *srcBuffer;
  ScriptContext *scriptContext_local;
  Var val_local;
  WebAssemblySource *this_local;
  
  srcBuffer = (BYTE *)scriptContext;
  scriptContext_local = (ScriptContext *)val;
  val_local = this;
  bVar2 = VarIs<Js::TypedArrayBase>(val);
  if (bVar2) {
    arrayBuffer = (ArrayBuffer *)VarTo<Js::TypedArrayBase>(scriptContext_local);
    array = (TypedArrayBase *)Js::TypedArrayBase::GetByteBuffer((TypedArrayBase *)arrayBuffer);
    uVar3 = Js::TypedArrayBase::GetByteLength((TypedArrayBase *)arrayBuffer);
    this->bufferLength = uVar3;
  }
  else {
    bVar2 = VarIs<Js::ArrayBuffer>(scriptContext_local);
    if (!bVar2) {
      JavascriptError::ThrowTypeError((ScriptContext *)srcBuffer,-0x7ff5e4a6,(PCWSTR)0x0);
    }
    local_38 = VarTo<Js::ArrayBuffer>(scriptContext_local);
    iVar4 = (*(local_38->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])();
    array = (TypedArrayBase *)CONCAT44(extraout_var,iVar4);
    uVar5 = (*(local_38->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x71])();
    this->bufferLength = uVar5;
  }
  if ((array == (TypedArrayBase *)0x0) && (this->bufferLength != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/WebAssemblySource.cpp"
                                ,0x2f,"(srcBuffer || bufferLength == 0)",
                                "srcBuffer || bufferLength == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->bufferLength != 0) {
    pRVar7 = ScriptContext::GetRecycler((ScriptContext *)srcBuffer);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&unsigned_char::typeinfo,0,(ulong)this->bufferLength,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/WebAssemblySource.cpp"
               ,0x33);
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_60);
    puVar8 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                       ((Memory *)pRVar7,(Recycler *)Memory::Recycler::AllocLeaf,0,
                        (ulong)this->bufferLength);
    this->buffer = puVar8;
    js_memcpy_s(this->buffer,(ulong)this->bufferLength,array,(ulong)this->bufferLength);
  }
  return;
}

Assistant:

void WebAssemblySource::ReadBufferSource(Var val, ScriptContext * scriptContext)
{
    BYTE* srcBuffer;
    if (Js::VarIs<Js::TypedArrayBase>(val))
    {
        Js::TypedArrayBase* array = Js::VarTo<Js::TypedArrayBase>(val);
        srcBuffer = array->GetByteBuffer();
        bufferLength = array->GetByteLength();
    }
    else if (Js::VarIs<Js::ArrayBuffer>(val))
    {
        Js::ArrayBuffer* arrayBuffer = Js::VarTo<Js::ArrayBuffer>(val);
        srcBuffer = arrayBuffer->GetBuffer();
        bufferLength = arrayBuffer->GetByteLength();
    }
    else
    {
        // The buffer was not a TypedArray nor an ArrayBuffer
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedBufferSource);
    }
    Assert(srcBuffer || bufferLength == 0);
    if (bufferLength > 0)
    {
        // copy buffer so external changes to it don't cause issues when defer parsing
        buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), byte, bufferLength);
        js_memcpy_s(buffer, bufferLength, srcBuffer, bufferLength);
    }
}